

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O0

void __thiscall
Commodore::Vic20::ConcreteMachine::set_key_state(ConcreteMachine *this,uint16_t key,bool is_pressed)

{
  element_type *peVar1;
  bool is_pressed_local;
  uint16_t key_local;
  ConcreteMachine *this_local;
  
  if (key < 0xfff0) {
    peVar1 = std::
             __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->keyboard_via_port_handler_);
    KeyboardVIA::set_key_state(peVar1,key,is_pressed);
  }
  else {
    switch(key) {
    case 0xfff0:
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x13,is_pressed);
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x403,is_pressed);
      break;
    case 0xfff1:
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x13,is_pressed);
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x402,is_pressed);
      break;
    case 0xfff2:
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x13,is_pressed);
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x404,is_pressed);
      break;
    case 0xfff3:
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x13,is_pressed);
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x405,is_pressed);
      break;
    case 0xfff4:
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x13,is_pressed);
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x406,is_pressed);
      break;
    case 0xfff5:
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x13,is_pressed);
      peVar1 = std::
               __shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->keyboard_via_port_handler_);
      KeyboardVIA::set_key_state(peVar1,0x407,is_pressed);
      break;
    case 0xfffd:
      MOS::MOS6522::MOS6522<Commodore::Vic20::UserPortVIA>::set_control_line_input
                (&this->user_port_via_,A,One,(bool)((is_pressed ^ 0xffU) & 1));
    }
  }
  return;
}

Assistant:

void set_key_state(uint16_t key, bool is_pressed) final {
			if(key < 0xfff0) {
				keyboard_via_port_handler_->set_key_state(key, is_pressed);
			} else {
				switch(key) {
					case KeyRestore:
						user_port_via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::One, !is_pressed);
					break;
#define ShiftedMap(source, target)	\
					case source:	\
						keyboard_via_port_handler_->set_key_state(KeyLShift, is_pressed);	\
						keyboard_via_port_handler_->set_key_state(target, is_pressed);	\
					break;

					ShiftedMap(KeyUp, KeyDown);
					ShiftedMap(KeyLeft, KeyRight);
					ShiftedMap(KeyF2, KeyF1);
					ShiftedMap(KeyF4, KeyF3);
					ShiftedMap(KeyF6, KeyF5);
					ShiftedMap(KeyF8, KeyF7);
#undef ShiftedMap
				}
			}
		}